

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

bool Js::JavascriptOperators::SetElementIOnTaggedNumber
               (Var receiver,RecyclableObject *object,Var index,Var value,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  IndexType IVar3;
  int iVar4;
  undefined4 *puVar5;
  Var local_48;
  Var index_local;
  PropertyRecord *propertyRecord;
  uint32 indexVal;
  
  local_48 = index;
  bVar2 = TaggedNumber::Is(receiver);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    propertyRecord._4_4_ = propertyOperationFlags;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xff5,"(TaggedNumber::Is(receiver))","TaggedNumber::Is(receiver)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    propertyOperationFlags = propertyRecord._4_4_;
  }
  propertyRecord._0_4_ = 0;
  index_local = (Var)0x0;
  IVar3 = GetIndexType(&local_48,requestContext,(uint32 *)&propertyRecord,
                       (PropertyRecord **)&index_local,true);
  if (IVar3 == IndexType_Number) {
    iVar4 = SetItemOnTaggedNumber
                      (receiver,object,(uint32)propertyRecord,value,requestContext,
                       propertyOperationFlags);
  }
  else {
    iVar4 = SetPropertyOnTaggedNumber
                      (receiver,object,*(PropertyId *)((long)index_local + 8),value,requestContext,
                       propertyOperationFlags);
  }
  return iVar4 != 0;
}

Assistant:

bool JavascriptOperators::SetElementIOnTaggedNumber(
        _In_ Var receiver,
        _In_ RecyclableObject* object,
        _In_ Var index,
        _In_ Var value,
        _In_ ScriptContext* requestContext,
        _In_ PropertyOperationFlags propertyOperationFlags)
    {
        Assert(TaggedNumber::Is(receiver));

        uint32 indexVal = 0;
        PropertyRecord const * propertyRecord = nullptr;
        IndexType indexType = GetIndexType(index, requestContext, &indexVal, &propertyRecord, true);
        if (indexType == IndexType_Number)
        {
            return  JavascriptOperators::SetItemOnTaggedNumber(receiver, object, indexVal, value, requestContext, propertyOperationFlags);
        }
        else
        {
            return  JavascriptOperators::SetPropertyOnTaggedNumber(receiver, object, propertyRecord->GetPropertyId(), value, requestContext, propertyOperationFlags);
        }
    }